

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O3

void If_DsdManPrintOccurs(FILE *pFile,If_DsdMan_t *p)

{
  int *piVar1;
  void **ppvVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  char Buffer [100];
  void *local_c0;
  double local_b0;
  char local_98 [104];
  
  iVar7 = (p->vObjs).nSize;
  if ((long)iVar7 < 3) {
    uVar11 = 0;
    local_b0 = 0.0;
    uVar8 = 10;
    uVar10 = 0x10;
LAB_00426daf:
    local_c0 = malloc((long)(int)uVar10 << 2);
    if (local_c0 == (void *)0x0) goto LAB_00426dd8;
    memset(local_c0,0,(long)(int)uVar8 << 2);
  }
  else {
    iVar4 = 0;
    lVar6 = 2;
    uVar9 = 0;
    do {
      uVar10 = *(uint *)((long)(p->vObjs).pArray[lVar6] + 4) >> 9 & 0x3ffff;
      iVar4 = iVar4 + uVar10;
      uVar11 = (ulong)uVar10;
      if (uVar10 < (uint)uVar9) {
        uVar11 = uVar9;
      }
      lVar6 = lVar6 + 1;
      uVar9 = uVar11;
    } while (iVar7 != lVar6);
    uVar5 = (uint)uVar11;
    if (1 < uVar5) {
      uVar10 = uVar5 - 1;
      uVar5 = 0;
      do {
        uVar5 = uVar5 + 1;
        bVar3 = 9 < uVar10;
        uVar10 = uVar10 / 10;
      } while (bVar3);
    }
    local_b0 = (double)iVar4;
    uVar8 = uVar5 * 10 + 10;
    uVar10 = 0x10;
    if (0xe < uVar5 * 10 + 9) {
      uVar10 = uVar8;
    }
    if (uVar10 != 0) goto LAB_00426daf;
LAB_00426dd8:
    local_c0 = (void *)0x0;
  }
  if (iVar7 < 3) {
    fwrite("The distribution of object occurrences:\n",0x28,1,(FILE *)pFile);
    if (0 < (int)uVar8) goto LAB_00426f12;
    if (local_c0 == (void *)0x0) goto LAB_00427065;
  }
  else {
    ppvVar2 = (p->vObjs).pArray;
    lVar6 = 2;
    do {
      uVar5 = *(uint *)((long)ppvVar2[lVar6] + 4) >> 9;
      uVar10 = uVar5 & 0x3ffff;
      uVar9 = (ulong)uVar10;
      if (uVar10 < 10) {
LAB_00426e28:
        if ((int)uVar8 <= (int)uVar9) {
LAB_004270c3:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
        }
      }
      else {
        if (uVar10 < 100) {
          uVar9 = (ulong)(byte)((char)((uVar5 & 0xff) / 10) + 10);
          goto LAB_00426e28;
        }
        if (uVar10 < 1000) {
          uVar10 = (uVar5 & 0xffff) / 100 + 0x14;
LAB_00426e7f:
          if ((int)uVar8 <= (int)uVar10) goto LAB_004270c3;
          uVar9 = (ulong)uVar10;
        }
        else {
          if (uVar10 < 10000) {
            uVar10 = (uVar5 & 0xffff) / 1000 + 0x1e;
            goto LAB_00426e7f;
          }
          if (uVar10 < 100000) {
            uVar10 = uVar10 / 10000 + 0x28;
          }
          else {
            uVar10 = uVar10 / 100000 + 0x32;
          }
          if ((int)uVar8 <= (int)uVar10) goto LAB_004270c3;
          uVar9 = (ulong)uVar10;
        }
      }
      piVar1 = (int *)((long)local_c0 + uVar9 * 4);
      *piVar1 = *piVar1 + 1;
      lVar6 = lVar6 + 1;
    } while (lVar6 < (p->vObjs).nSize);
    fwrite("The distribution of object occurrences:\n",0x28,1,(FILE *)pFile);
LAB_00426f12:
    uVar9 = 0;
    iVar7 = 0;
    do {
      if (uVar8 == uVar9) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (*(int *)((long)local_c0 + uVar9 * 4) != 0) {
        if (uVar9 < 10) {
          fprintf((FILE *)pFile,"%15d : ",uVar9 & 0xffffffff);
        }
        else {
          iVar4 = (int)((uVar9 & 0xffffffff) / 10) * -10;
          dVar13 = (double)(int)((uVar9 & 0xffffffff) / 10);
          dVar12 = pow(10.0,dVar13);
          dVar13 = pow(10.0,dVar13);
          sprintf(local_98,"%d - %d",(ulong)(uint)((iVar4 + (int)uVar9) * (int)dVar12),
                  (ulong)((iVar4 + (int)uVar9 + 1) * (int)dVar13 - 1));
          fprintf((FILE *)pFile,"%15s : ",local_98);
        }
        fprintf((FILE *)pFile,"%12d   ",(ulong)*(uint *)((long)local_c0 + uVar9 * 4));
        iVar7 = iVar7 + *(int *)((long)local_c0 + uVar9 * 4);
        fprintf((FILE *)pFile,"(%6.2f %%)",((double)iVar7 * 100.0) / (double)(p->vObjs).nSize);
        fputc(10,(FILE *)pFile);
      }
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  free(local_c0);
LAB_00427065:
  fprintf((FILE *)pFile,"Fanins: Max = %d. Ave = %.2f.\n",local_b0 / (double)(p->vObjs).nSize,uVar11
         );
  return;
}

Assistant:

void If_DsdManPrintOccurs( FILE * pFile, If_DsdMan_t * p )
{
    char Buffer[100];
    If_DsdObj_t * pObj;
    Vec_Int_t * vOccurs;
    int nOccurs, nOccursMax, nOccursAll;
    int i, k, nSizeMax, Counter = 0;
    // determine the largest fanin and fanout
    nOccursMax = nOccursAll = 0;
    If_DsdVecForEachNode( &p->vObjs, pObj, i )
    {
        nOccurs = pObj->Count;
        nOccursAll += nOccurs;
        nOccursMax  = Abc_MaxInt( nOccursMax, nOccurs );
    }
    // allocate storage for fanin/fanout numbers
    nSizeMax = 10 * (Abc_Base10Log(nOccursMax) + 1);
    vOccurs  = Vec_IntStart( nSizeMax );
    // count the number of fanins and fanouts
    If_DsdVecForEachNode( &p->vObjs, pObj, i )
    {
        nOccurs = pObj->Count;
        if ( nOccurs < 10 )
            Vec_IntAddToEntry( vOccurs, nOccurs, 1 );
        else if ( nOccurs < 100 )
            Vec_IntAddToEntry( vOccurs, 10 + nOccurs/10, 1 );
        else if ( nOccurs < 1000 )
            Vec_IntAddToEntry( vOccurs, 20 + nOccurs/100, 1 );
        else if ( nOccurs < 10000 )
            Vec_IntAddToEntry( vOccurs, 30 + nOccurs/1000, 1 );
        else if ( nOccurs < 100000 )
            Vec_IntAddToEntry( vOccurs, 40 + nOccurs/10000, 1 );
        else if ( nOccurs < 1000000 )
            Vec_IntAddToEntry( vOccurs, 50 + nOccurs/100000, 1 );
        else if ( nOccurs < 10000000 )
            Vec_IntAddToEntry( vOccurs, 60 + nOccurs/1000000, 1 );
    }
    fprintf( pFile, "The distribution of object occurrences:\n" );
    for ( k = 0; k < nSizeMax; k++ )
    {
        if ( Vec_IntEntry(vOccurs, k) == 0 )
            continue;
        if ( k < 10 )
            fprintf( pFile, "%15d : ", k );
        else
        {
            sprintf( Buffer, "%d - %d", (int)pow((double)10, k/10) * (k%10), (int)pow((double)10, k/10) * (k%10+1) - 1 );
            fprintf( pFile, "%15s : ", Buffer );
        }
        fprintf( pFile, "%12d   ", Vec_IntEntry(vOccurs, k) );
        Counter += Vec_IntEntry(vOccurs, k);
        fprintf( pFile, "(%6.2f %%)", 100.0*Counter/Vec_PtrSize(&p->vObjs) );
        fprintf( pFile, "\n" );
    }
    Vec_IntFree( vOccurs );
    fprintf( pFile, "Fanins: Max = %d. Ave = %.2f.\n", nOccursMax,  1.0*nOccursAll/Vec_PtrSize(&p->vObjs) );
}